

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O2

aspa_store_node ** aspa_store_get_node(aspa_store_node **node,rtr_socket *rtr_socket)

{
  aspa_store_node *paVar1;
  long in_FS_OFFSET;
  
  if ((node != (aspa_store_node **)0x0) &&
     (paVar1 = *node, rtr_socket != (rtr_socket *)0x0 && paVar1 != (aspa_store_node *)0x0)) {
    for (; paVar1 != (aspa_store_node *)0x0; paVar1 = paVar1->next) {
      if (paVar1->rtr_socket == rtr_socket) goto LAB_00105e32;
      node = &paVar1->next;
    }
  }
  node = (aspa_store_node **)0x0;
LAB_00105e32:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return node;
  }
  __stack_chk_fail();
}

Assistant:

static struct aspa_store_node **aspa_store_get_node(struct aspa_store_node **node, const struct rtr_socket *rtr_socket)
{
	if (!node || !*node || !rtr_socket)
		return NULL;

	while (*node) {
		if ((*node)->rtr_socket == rtr_socket)
			return node;
		node = &(*node)->next;
	}

	return NULL;
}